

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int mbedtls_pk_load_file(char *path,uchar **buf,size_t *n)

{
  FILE *__stream;
  size_t sVar1;
  uchar *puVar2;
  size_t sVar3;
  char *pcVar4;
  long size;
  FILE *f;
  size_t *n_local;
  uchar **buf_local;
  char *path_local;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    path_local._4_4_ = -0x3e00;
  }
  else {
    fseek(__stream,0,2);
    sVar1 = ftell(__stream);
    if (sVar1 == 0xffffffffffffffff) {
      fclose(__stream);
      path_local._4_4_ = -0x3e00;
    }
    else {
      fseek(__stream,0,0);
      *n = sVar1;
      if (*n != 0xffffffffffffffff) {
        puVar2 = (uchar *)calloc(1,*n + 1);
        *buf = puVar2;
        if (puVar2 != (uchar *)0x0) {
          sVar3 = fread(*buf,1,*n,__stream);
          if (sVar3 != *n) {
            fclose(__stream);
            free(*buf);
            return -0x3e00;
          }
          fclose(__stream);
          (*buf)[*n] = '\0';
          pcVar4 = strstr((char *)*buf,"-----BEGIN ");
          if (pcVar4 != (char *)0x0) {
            *n = *n + 1;
          }
          return 0;
        }
      }
      fclose(__stream);
      path_local._4_4_ = -0x3f80;
    }
  }
  return path_local._4_4_;
}

Assistant:

int mbedtls_pk_load_file( const char *path, unsigned char **buf, size_t *n )
{
    FILE *f;
    long size;

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_PK_FILE_IO_ERROR );

    fseek( f, 0, SEEK_END );
    if( ( size = ftell( f ) ) == -1 )
    {
        fclose( f );
        return( MBEDTLS_ERR_PK_FILE_IO_ERROR );
    }
    fseek( f, 0, SEEK_SET );

    *n = (size_t) size;

    if( *n + 1 == 0 ||
        ( *buf = mbedtls_calloc( 1, *n + 1 ) ) == NULL )
    {
        fclose( f );
        return( MBEDTLS_ERR_PK_ALLOC_FAILED );
    }

    if( fread( *buf, 1, *n, f ) != *n )
    {
        fclose( f );
        mbedtls_free( *buf );
        return( MBEDTLS_ERR_PK_FILE_IO_ERROR );
    }

    fclose( f );

    (*buf)[*n] = '\0';

    if( strstr( (const char *) *buf, "-----BEGIN " ) != NULL )
        ++*n;

    return( 0 );
}